

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_CDLDOJI_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,
                  int *outNBElement)

{
  TA_RetCode TVar1;
  double *in_stack_000000f8;
  double *in_stack_00000100;
  double *in_stack_00000108;
  double *in_stack_00000110;
  int in_stack_0000011c;
  int in_stack_00000120;
  int *in_stack_00000130;
  int *in_stack_00000138;
  int *in_stack_00000140;
  
  TVar1 = TA_CDLDOJI(in_stack_00000120,in_stack_0000011c,in_stack_00000110,in_stack_00000108,
                     in_stack_00000100,in_stack_000000f8,in_stack_00000130,in_stack_00000138,
                     in_stack_00000140);
  return TVar1;
}

Assistant:

TA_RetCode TA_CDLDOJI_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_CDLDOJI(
/* Generated */                 startIdx,
/* Generated */                 endIdx,
/* Generated */                 params->in[0].data.inPrice.open, /* inOpen */
/* Generated */                 params->in[0].data.inPrice.high, /* inHigh */
/* Generated */                 params->in[0].data.inPrice.low, /* inLow */
/* Generated */                 params->in[0].data.inPrice.close, /* inClose */
/* Generated */                 outBegIdx, 
/* Generated */                 outNBElement, 
/* Generated */                 params->out[0].data.outInteger /*  outInteger */ );
/* Generated */ }